

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.h
# Opt level: O0

void __thiscall xmrig::HttpData::HttpData(HttpData *this,uint64_t id)

{
  undefined8 in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1e6ead);
  std::__cxx11::string::string((string *)(in_RDI + 0xe));
  std::__cxx11::string::string((string *)(in_RDI + 0x16));
  *(undefined8 *)(in_RDI + 0x1e) = in_RSI;
  return;
}

Assistant:

inline HttpData(uint64_t id) : method(0), status(0), m_id(id) {}